

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

const_iterator __thiscall VulkanHppGenerator::findFeature(VulkanHppGenerator *this,string *name)

{
  FeatureData *pFVar1;
  __type_conflict _Var2;
  FeatureData *__lhs;
  
  __lhs = (this->m_features).
          super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pFVar1) {
      return (const_iterator)__lhs;
    }
    _Var2 = std::operator==(&__lhs->name,name);
    if (_Var2) break;
    __lhs = __lhs + 1;
  }
  return (const_iterator)__lhs;
}

Assistant:

std::vector<VulkanHppGenerator::FeatureData>::const_iterator VulkanHppGenerator::findFeature( std::string const & name ) const
{
  return std::ranges::find_if( m_features, [&name]( FeatureData const & fd ) { return fd.name == name; } );
}